

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIOHelpers.hpp
# Opt level: O1

TypeOneDRule TasGrid::IO::readRule<TasGrid::IO::mode_binary_type>(istream *is)

{
  TypeOneDRule TVar1;
  initializer_list<TasGrid::TypeOneDRule> __l;
  vector<TasGrid::TypeOneDRule,_std::allocator<TasGrid::TypeOneDRule>_> rmap;
  int v;
  allocator_type local_e1;
  vector<TasGrid::TypeOneDRule,_std::allocator<TasGrid::TypeOneDRule>_> local_e0;
  TypeOneDRule local_c4 [43];
  
  ::std::istream::read((char *)is,(long)local_c4);
  memcpy(local_c4,&DAT_001cbf78,0xac);
  __l._M_len = 0x2b;
  __l._M_array = local_c4;
  ::std::vector<TasGrid::TypeOneDRule,_std::allocator<TasGrid::TypeOneDRule>_>::vector
            (&local_e0,__l,&local_e1);
  TVar1 = rule_none;
  if ((ulong)(long)(int)local_c4[0] <
      (ulong)((long)local_e0.
                    super__Vector_base<TasGrid::TypeOneDRule,_std::allocator<TasGrid::TypeOneDRule>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_e0.
                    super__Vector_base<TasGrid::TypeOneDRule,_std::allocator<TasGrid::TypeOneDRule>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2)) {
    TVar1 = local_e0.
            super__Vector_base<TasGrid::TypeOneDRule,_std::allocator<TasGrid::TypeOneDRule>_>.
            _M_impl.super__Vector_impl_data._M_start[(int)local_c4[0]];
  }
  if (local_e0.super__Vector_base<TasGrid::TypeOneDRule,_std::allocator<TasGrid::TypeOneDRule>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.
                    super__Vector_base<TasGrid::TypeOneDRule,_std::allocator<TasGrid::TypeOneDRule>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e0.
                          super__Vector_base<TasGrid::TypeOneDRule,_std::allocator<TasGrid::TypeOneDRule>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.
                          super__Vector_base<TasGrid::TypeOneDRule,_std::allocator<TasGrid::TypeOneDRule>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return TVar1;
}

Assistant:

TypeOneDRule readRule(std::istream &is){
    if (std::is_same<iomode, mode_ascii_type>::value){
        std::string T;
        is >> T;
        return getRuleString(T);
    }else{
        return getRuleInt(readNumber<mode_binary_type, int>(is));
    }
}